

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# managed_buffer.cpp
# Opt level: O0

vec<3,_unsigned_int,_(glm::qualifier)0> __thiscall
polyscope::render::ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>::getValue
          (ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *this,size_t ind)

{
  vec<3,_unsigned_int,_(glm::qualifier)0> vVar1;
  bool bVar2;
  CanonicalDataSource CVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference pvVar5;
  element_type *this_00;
  int64_t iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *in_RDI;
  uvec3 uVar7;
  vec<3,_unsigned_int,_(glm::qualifier)0> val;
  function<void_()> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  size_t in_stack_fffffffffffffda8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  AttributeBuffer *in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  undefined8 local_220;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  string *in_stack_fffffffffffffdf0;
  function<void_()> local_1f0;
  string local_1d0 [32];
  ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *in_stack_fffffffffffffe50;
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [48];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_c;
  anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7 local_4;
  
  local_20 = in_RSI;
  bVar2 = deviceBufferTypeIsTexture(in_RDI);
  if (bVar2) {
    ensureHostBufferPopulated(in_stack_fffffffffffffe50);
  }
  CVar3 = currentCanonicalDataSource
                    ((ManagedBuffer<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_> *)
                     CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
  pbVar8 = local_20;
  if (CVar3 == HostData) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size(in_RDI->data);
    if (pbVar4 <= pbVar8) {
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffdc0));
      std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      exception(in_stack_fffffffffffffdf0);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_a0);
    }
    pvVar5 = std::
             vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             ::operator[](in_RDI->data,(size_type)local_20);
    local_c._0_4_ = pvVar5->field_0;
    local_c._4_4_ = pvVar5->field_1;
    local_4 = (anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7)
              (pvVar5->field_2).z;
  }
  else if (CVar3 == NeedsCompute) {
    std::function<void_()>::operator()(in_stack_fffffffffffffd90);
    pbVar8 = local_20;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             ::size(in_RDI->data);
    if (pbVar4 <= pbVar8) {
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0);
      std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffdc0));
      std::operator+(in_stack_fffffffffffffd98,(char *)in_stack_fffffffffffffd90);
      exception(in_stack_fffffffffffffdf0);
      std::__cxx11::string::~string(local_f0);
      std::__cxx11::string::~string(local_110);
      std::__cxx11::string::~string(local_170);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
    }
    pvVar5 = std::
             vector<glm::vec<3,_unsigned_int,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_unsigned_int,_(glm::qualifier)0>_>_>
             ::operator[](in_RDI->data,(size_type)local_20);
    local_c._0_4_ = pvVar5->field_0;
    local_c._4_4_ = pvVar5->field_1;
    local_4 = (anon_union_4_3_4e909dac_for_vec<3,_unsigned_int,_(glm::qualifier)0>_7)
              (pvVar5->field_2).z;
  }
  else if (CVar3 == RenderBuffer) {
    this_00 = std::
              __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x42cff7);
    iVar6 = AttributeBuffer::getDataSize(this_00);
    if (iVar6 <= (long)local_20) {
      in_stack_fffffffffffffd90 = &local_1f0;
      std::operator+((char *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                     in_stack_fffffffffffffdd0);
      std::operator+(local_20,(char *)in_stack_fffffffffffffd90);
      std::__cxx11::to_string((unsigned_long)in_RDI);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(CVar3,in_stack_fffffffffffffdc0));
      std::operator+(local_20,(char *)in_stack_fffffffffffffd90);
      exception(in_stack_fffffffffffffdf0);
      std::__cxx11::string::~string(local_190);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    std::
    __shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator*((__shared_ptr_access<polyscope::render::AttributeBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)in_stack_fffffffffffffd90);
    uVar7 = getAttributeBufferData<glm::vec<3,unsigned_int,(glm::qualifier)0>>
                      (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    local_220 = uVar7._0_8_;
    local_4 = uVar7.field_2;
    local_c = local_220;
  }
  else {
    memset(&local_c,0,0xc);
  }
  vVar1.field_2.z = local_4.z;
  vVar1.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_unsigned_int,_(glm::qualifier)0>_3)(undefined4)local_c;
  vVar1.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_unsigned_int,_(glm::qualifier)0>_5)local_c._4_4_;
  return vVar1;
}

Assistant:

T ManagedBuffer<T>::getValue(size_t ind) {

  // For the texture case, always copy to the host and pull from there
  if (deviceBufferTypeIsTexture()) {
    ensureHostBufferPopulated();
  }

  switch (currentCanonicalDataSource()) {
  case CanonicalDataSource::HostData:
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::NeedsCompute:
    computeFunc();
    if (ind >= data.size())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");
    return data[ind];
    break;

  case CanonicalDataSource::RenderBuffer:

    // NOTE: right now this case should never happen unless deviceBufferType == DeviceBufferType::Attribute.
    // In the texture case, we cannot get a single pixel from the backend anyway, so we always
    // call ensureHostBufferPopulated() above and do the host access.

    if (static_cast<int64_t>(ind) >= renderAttributeBuffer->getDataSize())
      exception("out of bounds access in ManagedBuffer " + name + " getValue(" + std::to_string(ind) + ")");

    T val = getAttributeBufferData<T>(*renderAttributeBuffer, ind);
    return val;
    break;
  };

  return T(); // dummy return
}